

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader15.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::FormulasLoader15::begin__arccsc(FormulasLoader15 *this)

{
  arccsc__AttributeData *in_stack_00000238;
  FormulasLoader15 *in_stack_00000240;
  
  begin__arccsc(in_stack_00000240,in_stack_00000238);
  return;
}

Assistant:

bool FormulasLoader15::begin__arccsc( const COLLADASaxFWL15::arccsc__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__arccsc(attributeData));
COLLADASaxFWL::arccsc__AttributeData attrData;
attrData.style = attributeData.style;
attrData.xref = attributeData.xref;
attrData.id = attributeData.id;
attrData.encoding = attributeData.encoding;
attrData.unknownAttributes = attributeData.unknownAttributes;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::arccsc__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == COLLADASaxFWL15::arccsc__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT ) {
    attrData.definitionURL = attributeData.definitionURL;
    attrData.present_attributes |= COLLADASaxFWL::arccsc__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::arccsc__AttributeData::ATTRIBUTE__CLASS_PRESENT) == COLLADASaxFWL15::arccsc__AttributeData::ATTRIBUTE__CLASS_PRESENT ) {
    attrData._class = attributeData._class;
    attrData.present_attributes |= COLLADASaxFWL::arccsc__AttributeData::ATTRIBUTE__CLASS_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::arccsc__AttributeData::ATTRIBUTE_HREF_PRESENT) == COLLADASaxFWL15::arccsc__AttributeData::ATTRIBUTE_HREF_PRESENT ) {
    attrData.href = attributeData.href;
    attrData.present_attributes |= COLLADASaxFWL::arccsc__AttributeData::ATTRIBUTE_HREF_PRESENT;
}
return mLoader->begin__arccsc(attrData);
}